

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

Variable * __thiscall soul::Optimisations::Inliner::getRemappedVariable(Inliner *this,Variable *old)

{
  Module *this_00;
  Allocator *this_01;
  bool bVar1;
  mapped_type *this_02;
  CodeLocation *args;
  Type *args_1;
  string *psVar2;
  Variable *pVVar3;
  Annotation *other;
  string local_d8;
  string local_b8;
  byte local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  Identifier local_50;
  pool_ptr<soul::heart::Variable> local_48 [3];
  pool_ref<soul::heart::Variable> local_30;
  mapped_type *local_28;
  mapped_type *v;
  Variable *old_local;
  Inliner *this_local;
  
  v = (mapped_type *)old;
  old_local = (Variable *)this;
  bVar1 = heart::Variable::isFunctionLocal(old);
  if ((bVar1) || (bVar1 = heart::Variable::isParameter((Variable *)v), bVar1)) {
    pool_ref<soul::heart::Variable>::pool_ref<soul::heart::Variable,void>(&local_30,(Variable *)v);
    this_02 = std::
              unordered_map<soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>,_std::hash<soul::pool_ref<soul::heart::Variable>_>,_std::equal_to<soul::pool_ref<soul::heart::Variable>_>,_std::allocator<std::pair<const_soul::pool_ref<soul::heart::Variable>,_soul::pool_ptr<soul::heart::Variable>_>_>_>
              ::operator[](&this->remappedVariables,&local_30);
    pool_ref<soul::heart::Variable>::~pool_ref(&local_30);
    local_28 = this_02;
    bVar1 = pool_ptr<soul::heart::Variable>::operator==(this_02,(void *)0x0);
    if (bVar1) {
      this_00 = this->module;
      args = (CodeLocation *)(v + 1);
      args_1 = (Type *)(v + 3);
      bVar1 = Identifier::isValid((Identifier *)(v + 6));
      local_91 = 0;
      if (bVar1) {
        this_01 = this->module->allocator;
        std::operator+(&local_90,&this->inlinedFnName,"_");
        local_91 = 1;
        psVar2 = Identifier::operator_cast_to_string_((Identifier *)(v + 6));
        std::__cxx11::string::string((string *)&local_d8,(string *)psVar2);
        makeSafeIdentifierName(&local_b8,&local_d8);
        std::operator+(&local_70,&local_90,&local_b8);
        local_50 = heart::Allocator::get<std::__cxx11::string>(this_01,&local_70);
      }
      else {
        memset(&local_50,0,8);
        Identifier::Identifier(&local_50);
      }
      pVVar3 = Module::
               allocate<soul::heart::Variable,soul::CodeLocation&,soul::Type&,soul::Identifier,soul::heart::Variable::Role&>
                         (this_00,args,args_1,&local_50,(Role *)(v + 7));
      pool_ptr<soul::heart::Variable>::pool_ptr<soul::heart::Variable,void>(local_48,pVVar3);
      local_28->object = local_48[0].object;
      pool_ptr<soul::heart::Variable>::~pool_ptr(local_48);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      if ((local_91 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_90);
      }
      other = (Annotation *)(v + 8);
      pVVar3 = pool_ptr<soul::heart::Variable>::operator->(local_28);
      Annotation::operator=(&pVVar3->annotation,other);
    }
    this_local = (Inliner *)pool_ptr<soul::heart::Variable>::operator*(local_28);
  }
  else {
    this_local = (Inliner *)v;
  }
  return (Variable *)this_local;
}

Assistant:

heart::Variable& getRemappedVariable (heart::Variable& old)
        {
            if (old.isFunctionLocal() || old.isParameter())
            {
                auto& v = remappedVariables[old];

                if (v == nullptr)
                {
                    v = module.allocate<heart::Variable> (old.location, old.type,
                                                          old.name.isValid() ? module.allocator.get (inlinedFnName + "_" + makeSafeIdentifierName (old.name))
                                                                             : Identifier(),
                                                          old.role);
                    v->annotation = old.annotation;
                }

                return *v;
            }

            return old;
        }